

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void SummonActor(int command,int command2,FCommandLine *argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  PClassActor *pPVar4;
  int local_44;
  BYTE local_3c;
  short local_38;
  BYTE local_34;
  int local_24;
  int i;
  PClassActor *type;
  FCommandLine *argv_local;
  int command2_local;
  int command_local;
  
  local_34 = (BYTE)command;
  bVar1 = CheckCheatmode(true);
  if ((!bVar1) && (iVar2 = FCommandLine::argc(argv), 1 < iVar2)) {
    pcVar3 = FCommandLine::operator[](argv,1);
    pPVar4 = PClass::FindActor(pcVar3);
    if (pPVar4 == (PClassActor *)0x0) {
      pcVar3 = FCommandLine::operator[](argv,1);
      Printf("Unknown actor \'%s\'\n",pcVar3);
    }
    else {
      iVar2 = FCommandLine::argc(argv);
      if (2 < iVar2) {
        local_34 = (BYTE)command2;
      }
      Net_WriteByte(local_34);
      pcVar3 = FName::GetChars(&(pPVar4->super_PClass).super_PNativeStruct.super_PStruct.
                                super_PNamedType.TypeName);
      Net_WriteString(pcVar3);
      iVar2 = FCommandLine::argc(argv);
      if (2 < iVar2) {
        pcVar3 = FCommandLine::operator[](argv,2);
        iVar2 = atoi(pcVar3);
        Net_WriteWord((short)iVar2);
        iVar2 = FCommandLine::argc(argv);
        if (iVar2 < 4) {
          local_38 = 0;
        }
        else {
          pcVar3 = FCommandLine::operator[](argv,3);
          iVar2 = atoi(pcVar3);
          local_38 = (short)iVar2;
        }
        Net_WriteWord(local_38);
        iVar2 = FCommandLine::argc(argv);
        if (iVar2 < 5) {
          local_3c = '\0';
        }
        else {
          pcVar3 = FCommandLine::operator[](argv,4);
          iVar2 = atoi(pcVar3);
          local_3c = (BYTE)iVar2;
        }
        Net_WriteByte(local_3c);
        for (local_24 = 5; local_24 < 10; local_24 = local_24 + 1) {
          iVar2 = FCommandLine::argc(argv);
          if (local_24 < iVar2) {
            pcVar3 = FCommandLine::operator[](argv,local_24);
            local_44 = atoi(pcVar3);
          }
          else {
            local_44 = 0;
          }
          Net_WriteLong(local_44);
        }
      }
    }
  }
  return;
}

Assistant:

static void SummonActor (int command, int command2, FCommandLine argv)
{
	if (CheckCheatmode ())
		return;

	if (argv.argc() > 1)
	{
		PClassActor *type = PClass::FindActor(argv[1]);
		if (type == NULL)
		{
			Printf ("Unknown actor '%s'\n", argv[1]);
			return;
		}
		Net_WriteByte (argv.argc() > 2 ? command2 : command);
		Net_WriteString (type->TypeName.GetChars());

		if (argv.argc () > 2)
		{
			Net_WriteWord (atoi (argv[2])); // angle
			Net_WriteWord ((argv.argc() > 3) ? atoi(argv[3]) : 0); // TID
			Net_WriteByte ((argv.argc() > 4) ? atoi(argv[4]) : 0); // special
			for (int i = 5; i < 10; i++)
			{ // args[5]
				Net_WriteLong((i < argv.argc()) ? atoi(argv[i]) : 0);
			}
		}
	}
}